

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<llbuild::basic::FileInfo,_true>::push_back
          (SmallVectorTemplateBase<llbuild::basic::FileInfo,_true> *this,FileInfo *Elt)

{
  uint uVar1;
  long lVar2;
  uint64_t *puVar3;
  byte bVar4;
  
  bVar4 = 0;
  uVar1 = (this->super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>).super_SmallVectorBase.
      Capacity <= uVar1) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,0,0x50);
    uVar1 = (this->super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>).
            super_SmallVectorBase.Size;
  }
  puVar3 = (uint64_t *)
           ((ulong)uVar1 * 0x50 +
           (long)(this->super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>).
                 super_SmallVectorBase.BeginX);
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar3 = Elt->device;
    Elt = (FileInfo *)((long)Elt + (ulong)bVar4 * -0x10 + 8);
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  uVar1 = (this->super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>).
          super_SmallVectorBase.Size;
  if (uVar1 < (this->super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>).
              super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>).super_SmallVectorBase.
    Size = uVar1 + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }